

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  string precision;
  string statements;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  float local_30c;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  undefined8 local_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_30c = 0.0;
  if (0 < this->m_numLoopIterations) {
    iVar5 = 0;
    do {
      local_30c = local_30c + (float)iVar5 * 3.2 + 4.6;
      iVar5 = iVar5 + 1;
    } while (this->m_numLoopIterations != iVar5);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  if (CASESHADERTYPE_FRAGMENT < (this->super_ShaderOptimizationCase).m_caseShaderType) {
    uVar4 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if ((optimized) && (local_350 != &local_340)) {
      operator_delete(local_350,local_340 + 1);
    }
    if ((optimized) && (local_288 != local_278)) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if ((optimized) && (local_330 != &local_320)) {
      operator_delete(local_330,local_320 + 1);
    }
    if ((optimized) && (local_208 != &local_1f8)) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if ((optimized) && (local_228 != &local_218)) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((optimized) && (local_308 != &local_2f8)) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if ((optimized) && (local_268 != local_258)) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if ((optimized) && (local_2a8 != &local_298)) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((optimized) && (local_2c8 != &local_2b8)) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((optimized) && (local_2e8 != &local_2d8)) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if ((optimized) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_248.field_2._M_local_buf[5],
                                        CONCAT14(local_248.field_2._M_local_buf[4],
                                                 local_248.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar4);
  }
  local_30c = 1.0 / local_30c;
  local_248.field_2._M_local_buf[4] = 'p';
  local_248.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_248._M_string_length = 5;
  local_248.field_2._M_local_buf[5] = '\0';
  if (optimized) {
    std::operator+(&local_1c8,"\t",&local_248);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_2e8 = &local_2d8;
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_2d8 = *puVar6;
      lStack_2d0 = plVar2[3];
    }
    else {
      local_2d8 = *puVar6;
      local_2e8 = (ulong *)*plVar2;
    }
    local_2e0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_248._M_dataplus._M_p);
    local_2c8 = &local_2b8;
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_2b8 = *puVar6;
      uStack_2b0 = puVar3[3];
    }
    else {
      local_2b8 = *puVar6;
      local_2c8 = (ulong *)*puVar3;
    }
    local_2c0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_298 = *puVar6;
      lStack_290 = plVar2[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *puVar6;
      local_2a8 = (ulong *)*plVar2;
    }
    local_2a0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_2a8 != &local_298) {
      uVar8 = local_298;
    }
    if (uVar8 < (ulong)(local_260 + local_2a0)) {
      uVar8 = 0xf;
      if (local_268 != local_258) {
        uVar8 = local_258[0];
      }
      if (uVar8 < (ulong)(local_260 + local_2a0)) goto LAB_012f9a09;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_012f9a09:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_268);
    }
    local_308 = &local_2f8;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_2f8 = *plVar2;
      uStack_2f0 = puVar3[3];
    }
    else {
      local_2f8 = *plVar2;
      local_308 = (long *)*puVar3;
    }
    local_300 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_308);
    local_228 = &local_218;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_218 = *plVar2;
      lStack_210 = puVar3[3];
    }
    else {
      local_218 = *plVar2;
      local_228 = (long *)*puVar3;
    }
    local_220 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    local_208 = &local_1f8;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_1f8 = *plVar2;
      lStack_1f0 = puVar3[3];
    }
    else {
      local_1f8 = *plVar2;
      local_208 = (long *)*puVar3;
    }
    local_200 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_320 = *puVar6;
      lStack_318 = puVar3[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar6;
      local_330 = (ulong *)*puVar3;
    }
    local_328 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_330 != &local_320) {
      uVar8 = local_320;
    }
    if (uVar8 < (ulong)(local_280 + local_328)) {
      uVar8 = 0xf;
      if (local_288 != local_278) {
        uVar8 = local_278[0];
      }
      if (uVar8 < (ulong)(local_280 + local_328)) goto LAB_012f9f4d;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_012f9f4d:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_340 = *plVar2;
      uStack_338 = puVar3[3];
    }
    else {
      local_340 = *plVar2;
      local_350 = (long *)*puVar3;
    }
    local_348 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  }
  else {
    std::operator+(&local_1c8,"\t",&local_248);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_2d8 = *puVar6;
      lStack_2d0 = puVar3[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8 = *puVar6;
      local_2e8 = (ulong *)*puVar3;
    }
    local_2e0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar8 = local_2d8;
    }
    if (uVar8 < (ulong)(local_260 + local_2e0)) {
      uVar8 = 0xf;
      if (local_268 != local_258) {
        uVar8 = local_258[0];
      }
      if (uVar8 < (ulong)(local_260 + local_2e0)) goto LAB_012f98bf;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_012f98bf:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
    }
    local_2c8 = &local_2b8;
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_2b8 = *puVar6;
      uStack_2b0 = puVar3[3];
    }
    else {
      local_2b8 = *puVar6;
      local_2c8 = (ulong *)*puVar3;
    }
    local_2c0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_298 = *puVar6;
      lStack_290 = puVar3[3];
    }
    else {
      local_298 = *puVar6;
      local_2a8 = (ulong *)*puVar3;
    }
    local_2a0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_248._M_dataplus._M_p);
    local_308 = &local_2f8;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_2f8 = *plVar2;
      uStack_2f0 = puVar3[3];
    }
    else {
      local_2f8 = *plVar2;
      local_308 = (long *)*puVar3;
    }
    local_300 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_228 = &local_218;
    plVar7 = plVar2 + 2;
    if ((long *)*plVar2 == plVar7) {
      local_218 = *plVar7;
      lStack_210 = plVar2[3];
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*plVar2;
    }
    local_220 = plVar2[1];
    *plVar2 = (long)plVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    local_208 = &local_1f8;
    plVar7 = plVar2 + 2;
    if ((long *)*plVar2 == plVar7) {
      local_1f8 = *plVar7;
      lStack_1f0 = plVar2[3];
    }
    else {
      local_1f8 = *plVar7;
      local_208 = (long *)*plVar2;
    }
    local_200 = plVar2[1];
    *plVar2 = (long)plVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_320 = *puVar6;
      lStack_318 = plVar2[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar6;
      local_330 = (ulong *)*plVar2;
    }
    local_328 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_330 != &local_320) {
      uVar8 = local_320;
    }
    if (uVar8 < (ulong)(local_280 + local_328)) {
      uVar8 = 0xf;
      if (local_288 != local_278) {
        uVar8 = local_278[0];
      }
      if (uVar8 < (ulong)(local_280 + local_328)) goto LAB_012f9d17;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_012f9d17:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_340 = *plVar2;
      uStack_338 = puVar3[3];
    }
    else {
      local_340 = *plVar2;
      local_350 = (long *)*puVar3;
    }
    local_348 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8.field_2._8_8_ = puVar3[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_1e8._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (optimized) {
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    local_258[0] = local_2b8;
    local_268 = local_2c8;
    if (local_2c8 == &local_2b8) goto LAB_012fa2ba;
  }
  else {
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_268 == local_258) goto LAB_012fa2ba;
  }
  operator_delete(local_268,local_258[0] + 1);
LAB_012fa2ba:
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_248.field_2._M_local_buf[5],
                                      CONCAT14(local_248.field_2._M_local_buf[4],
                                               local_248.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}